

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void polyscope::view::updateFlight(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  bool bVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 in_XMM25 [16];
  vec3 local_90;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_80;
  float local_7c;
  undefined4 local_78;
  undefined4 local_74;
  float local_70;
  float local_6c;
  undefined4 local_68;
  undefined4 local_64;
  float local_60;
  float local_5c;
  float local_58;
  uint local_54;
  mat4 local_50;
  
  if (midflight == '\x01') {
    dVar20 = ImGui::GetTime();
    if (dVar20 <= (double)flightEndTime) {
      dVar20 = ImGui::GetTime();
      dVar20 = (dVar20 - (double)flightStartTime) / (double)(flightEndTime - flightStartTime);
      auVar21._0_4_ = (float)dVar20;
      auVar21._4_4_ = (int)((ulong)dVar20 >> 0x20);
      auVar21._8_8_ = 0;
      auVar14._0_12_ = ZEXT812(0);
      auVar14._12_4_ = 0;
      auVar9 = vmaxss_avx(auVar14,auVar21);
      auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar9);
      auVar11 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar10,ZEXT416(0x40400000));
      auVar15._8_8_ = 0;
      auVar15._0_8_ = flightInitialViewR;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = DAT_00600710;
      auVar17._4_4_ = flightTargetViewR._4_4_;
      auVar17._0_4_ = (float)flightTargetViewR;
      auVar17._8_8_ = 0;
      auVar13._4_4_ = DAT_006006f0._4_4_;
      auVar13._0_4_ = (float)DAT_006006f0;
      auVar13._8_8_ = 0;
      auVar9._0_4_ = (float)DAT_00600710 * (float)DAT_006006f0;
      auVar9._4_4_ = (float)(DAT_00600710 >> 0x20) * DAT_006006f0._4_4_;
      auVar9._8_8_ = 0;
      auVar9 = vshufps_avx(auVar9,auVar9,0xe1);
      auVar12._0_4_ = (float)flightTargetViewR * (float)flightInitialViewR + auVar9._0_4_;
      auVar12._4_4_ = flightTargetViewR._4_4_ * (float)(flightInitialViewR >> 0x20) + auVar9._4_4_;
      auVar12._8_4_ = auVar9._8_4_ + 0.0;
      auVar12._12_4_ = auVar9._12_4_ + 0.0;
      auVar9 = vhaddps_avx(auVar12,auVar12);
      auVar19._8_4_ = 0x80000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar19._12_4_ = 0x80000000;
      fVar27 = auVar10._0_4_ * auVar10._0_4_ * auVar11._0_4_;
      uVar6 = vcmpss_avx512f(auVar9,auVar14,1);
      bVar7 = (bool)((byte)uVar6 & 1);
      fVar29 = 1.0 - fVar27;
      fVar8 = (float)((uint)bVar7 * (int)-fVar27 + (uint)!bVar7 * (int)fVar27);
      auVar9 = vmovshdup_avx(auVar16);
      auVar10 = vmovshdup_avx(auVar15);
      auVar11 = vmovshdup_avx(auVar13);
      fVar23 = auVar11._0_4_ * fVar8 + fVar29 * auVar9._0_4_;
      fVar25 = fVar29 * (float)flightInitialViewR + (float)flightTargetViewR * fVar8;
      auVar9 = vmovshdup_avx(auVar17);
      fVar22 = fVar29 * auVar10._0_4_ + auVar9._0_4_ * fVar8;
      fVar1 = fVar29 * (float)DAT_00600710 + (float)DAT_006006f0 * fVar8;
      fVar2 = fVar29 * DAT_00600724 + fVar8 * DAT_00600704;
      fVar3 = fVar29 * DAT_00600718 + fVar8 * DAT_006006f8;
      fVar26 = fVar29 * DAT_0060071c + fVar8 * DAT_006006fc;
      fVar8 = fVar29 * DAT_00600720 + fVar8 * DAT_00600700;
      local_90.field_2.z = fVar29 * DAT_0060073c + fVar27 * DAT_00600730;
      auVar10._0_4_ = fVar29 * (float)flightInitialViewT + (float)flightTargetViewT * fVar27;
      auVar10._4_4_ =
           fVar29 * (float)((ulong)flightInitialViewT >> 0x20) +
           (float)((ulong)flightTargetViewT >> 0x20) * fVar27;
      auVar10._8_4_ = fVar29 * 0.0 + fVar27 * 0.0;
      auVar10._12_4_ = fVar29 * 0.0 + fVar27 * 0.0;
      local_90._0_8_ = vmovlps_avx(auVar10);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar22)),ZEXT416((uint)fVar25),
                               ZEXT416((uint)fVar25));
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar1),ZEXT416((uint)fVar1));
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar23),ZEXT416((uint)fVar23));
      fVar24 = auVar9._0_4_;
      fVar27 = fVar23 / fVar24;
      fVar29 = fVar25 / fVar24;
      fVar31 = fVar22 / fVar24;
      fVar24 = fVar1 / fVar24;
      fVar23 = fVar23 * fVar27;
      fVar4 = fVar25 * fVar29;
      local_58 = fVar31 * fVar22;
      fVar5 = fVar1 * fVar24;
      fVar27 = fVar27 + fVar27;
      fVar29 = fVar29 + fVar29;
      fVar31 = fVar31 + fVar31;
      fVar24 = fVar24 + fVar24;
      auVar9 = vmulss_avx512f(ZEXT416((uint)fVar22),ZEXT416((uint)fVar29));
      auVar10 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar29));
      auVar11 = vmulss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar31));
      auVar12 = vaddss_avx512f(ZEXT416((uint)fVar23),ZEXT416((uint)fVar4));
      auVar12 = vsubss_avx512f(auVar12,ZEXT416((uint)local_58));
      auVar12 = vsubss_avx512f(auVar12,ZEXT416((uint)fVar5));
      auVar13 = vsubss_avx512f(auVar9,ZEXT416((uint)(fVar27 * fVar1)));
      auVar14 = vaddss_avx512f(auVar10,ZEXT416((uint)(fVar27 * fVar22)));
      auVar28 = ZEXT416((uint)fVar27);
      auVar15 = vmulss_avx512f(auVar28,ZEXT416((uint)fVar3));
      auVar30 = ZEXT416((uint)fVar29);
      auVar15 = vfmsub231ss_avx512f(auVar15,ZEXT416((uint)fVar2),auVar30);
      auVar15 = vfmadd231ss_avx512f(auVar15,ZEXT416((uint)fVar26),ZEXT416((uint)fVar24));
      auVar15 = vfnmadd231ss_avx512f(auVar15,ZEXT416((uint)fVar8),ZEXT416((uint)fVar31));
      auVar15 = vxorps_avx512vl(auVar15,auVar19);
      auVar16 = vaddss_avx512f(auVar9,ZEXT416((uint)(fVar27 * fVar1)));
      auVar9 = vaddss_avx512f(ZEXT416((uint)fVar23),ZEXT416((uint)local_58));
      auVar9 = vsubss_avx512f(auVar9,ZEXT416((uint)fVar4));
      auVar17 = vsubss_avx512f(auVar9,ZEXT416((uint)fVar5));
      auVar18 = vsubss_avx512f(auVar11,ZEXT416((uint)(fVar25 * fVar27)));
      auVar9 = vmulss_avx512f(ZEXT416((uint)fVar24),ZEXT416((uint)fVar3));
      auVar9 = vfmsub231ss_avx512f(auVar9,ZEXT416((uint)fVar2),ZEXT416((uint)fVar31));
      auVar9 = vfnmadd231ss_avx512f(auVar9,ZEXT416((uint)fVar26),auVar28);
      auVar9 = vfmadd231ss_avx512f(auVar9,ZEXT416((uint)fVar8),auVar30);
      auVar19 = vxorps_avx512vl(auVar9,auVar19);
      auVar10 = vsubss_avx512f(auVar10,ZEXT416((uint)(fVar27 * fVar22)));
      auVar11 = vaddss_avx512f(auVar11,ZEXT416((uint)(fVar25 * fVar27)));
      local_58 = ((fVar23 + fVar5) - fVar4) - local_58;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar31 * fVar3)),ZEXT416((uint)fVar2),
                               ZEXT416((uint)fVar24));
      auVar9 = vfnmadd231ss_fma(auVar9,ZEXT416((uint)fVar26),auVar30);
      auVar9 = vfnmadd231ss_fma(auVar9,ZEXT416((uint)fVar8),auVar28);
      local_54 = auVar9._0_4_ ^ 0x80000000;
      local_80 = auVar12._0_4_;
      local_7c = auVar13._0_4_;
      local_78 = auVar14._0_4_;
      local_74 = auVar15._0_4_;
      local_70 = auVar16._0_4_;
      local_6c = auVar17._0_4_;
      local_68 = auVar18._0_4_;
      local_64 = auVar19._0_4_;
      local_60 = auVar10._0_4_;
      local_5c = auVar11._0_4_;
      buildTransform(&local_50,(mat3x4 *)&local_80,&local_90);
      viewMat = local_50.value[0].field_0;
      viewMat_4 = local_50.value[0].field_1;
      DAT_006006ac._0_4_ = local_50.value[0].field_2;
      DAT_006006ac._4_4_ = local_50.value[0].field_3;
      DAT_006006b4._0_4_ = local_50.value[1].field_0;
      DAT_006006b4._4_4_ = local_50.value[1].field_1;
      DAT_006006bc = local_50.value[1].field_2;
      _DAT_006006c0 = local_50.value[1].field_3;
      DAT_006006c4._0_4_ = local_50.value[2].field_0;
      DAT_006006c4._4_4_ = local_50.value[2].field_1;
      DAT_006006cc._0_4_ = local_50.value[2].field_2;
      DAT_006006cc._4_4_ = local_50.value[2].field_3;
      DAT_006006d4._0_4_ = local_50.value[3].field_0;
      DAT_006006d4._4_4_ = local_50.value[3].field_1;
      DAT_006006dc._0_4_ = local_50.value[3].field_2;
      DAT_006006dc._4_4_ = local_50.value[3].field_3;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(auVar21._0_4_ * flightTargetFov)),
                               ZEXT416((uint)(1.0 - auVar21._0_4_)),ZEXT416(flightInitialFov));
      fov = (double)auVar9._0_4_;
    }
    else {
      midflight = '\0';
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(flightTargetViewR._4_4_ * flightTargetViewR._4_4_)),
                               ZEXT416((uint)(float)flightTargetViewR),
                               ZEXT416((uint)(float)flightTargetViewR));
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)(float)DAT_006006f0),
                               ZEXT416((uint)(float)DAT_006006f0));
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)DAT_006006f0._4_4_),
                               ZEXT416((uint)DAT_006006f0._4_4_));
      fVar22 = auVar9._0_4_;
      fVar23 = DAT_006006f0._4_4_ / fVar22;
      fVar25 = (float)flightTargetViewR / fVar22;
      fVar26 = flightTargetViewR._4_4_ / fVar22;
      fVar22 = (float)DAT_006006f0 / fVar22;
      fVar1 = DAT_006006f0._4_4_ * fVar23;
      fVar2 = (float)flightTargetViewR * fVar25;
      local_58 = flightTargetViewR._4_4_ * fVar26;
      fVar3 = (float)DAT_006006f0 * fVar22;
      fVar23 = fVar23 + fVar23;
      fVar25 = fVar25 + fVar25;
      fVar22 = fVar22 + fVar22;
      local_5c = (float)DAT_006006f0 * (fVar26 + fVar26);
      local_80.x = ((fVar2 + fVar1) - local_58) - fVar3;
      local_7c = flightTargetViewR._4_4_ * fVar25 - (float)DAT_006006f0 * fVar23;
      auVar9 = vaddss_avx512f(ZEXT416((uint)((float)DAT_006006f0 * fVar25)),
                              ZEXT416((uint)(flightTargetViewR._4_4_ * fVar23)));
      auVar15 = ZEXT416((uint)fVar23);
      auVar10 = vmulss_avx512f(auVar15,ZEXT416((uint)DAT_006006f8));
      auVar16 = ZEXT416((uint)fVar25);
      auVar10 = vfmsub231ss_avx512f(auVar10,ZEXT416((uint)DAT_00600704),auVar16);
      auVar10 = vfmadd231ss_avx512f(auVar10,ZEXT416((uint)DAT_006006fc),ZEXT416((uint)fVar22));
      auVar11 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar14 = ZEXT416((uint)(fVar26 + fVar26));
      auVar10 = vfnmadd231ss_avx512f(auVar10,ZEXT416((uint)DAT_00600700),auVar14);
      auVar10 = vxorps_avx512vl(auVar10,auVar11);
      local_70 = flightTargetViewR._4_4_ * fVar25 + (float)DAT_006006f0 * fVar23;
      local_6c = ((local_58 + fVar1) - fVar2) - fVar3;
      auVar12 = vsubss_avx512f(ZEXT416((uint)local_5c),
                               ZEXT416((uint)((float)flightTargetViewR * fVar23)));
      auVar13 = vmulss_avx512f(ZEXT416((uint)fVar22),ZEXT416((uint)DAT_006006f8));
      auVar13 = vfmsub231ss_avx512f(auVar13,ZEXT416((uint)DAT_00600704),auVar14);
      auVar13 = vfnmadd231ss_avx512f(auVar13,ZEXT416((uint)DAT_006006fc),auVar15);
      auVar13 = vfmadd231ss_avx512f(auVar13,ZEXT416((uint)DAT_00600700),auVar16);
      auVar13 = vxorps_avx512vl(auVar13,auVar11);
      local_60 = (float)DAT_006006f0 * fVar25 - flightTargetViewR._4_4_ * fVar23;
      local_5c = local_5c + (float)flightTargetViewR * fVar23;
      local_58 = ((fVar3 + fVar1) - fVar2) - local_58;
      auVar14 = vmulss_avx512f(ZEXT416((uint)DAT_006006f8),auVar14);
      auVar14 = vfmadd231ss_avx512f(auVar14,ZEXT416((uint)DAT_00600704),ZEXT416((uint)fVar22));
      auVar14 = vfnmadd231ss_avx512f(auVar14,ZEXT416((uint)DAT_006006fc),auVar16);
      auVar14 = vfnmadd231ss_avx512f(auVar14,ZEXT416((uint)DAT_00600700),auVar15);
      auVar11 = vxorps_avx512vl(auVar14,auVar11);
      local_78 = auVar9._0_4_;
      local_74 = auVar10._0_4_;
      local_68 = auVar12._0_4_;
      local_64 = auVar13._0_4_;
      local_54 = auVar11._0_4_;
      buildTransform(&local_50,(mat3x4 *)&local_80,(vec3 *)&flightTargetViewT);
      viewMat = local_50.value[0].field_0;
      viewMat_4 = local_50.value[0].field_1;
      DAT_006006ac._0_4_ = local_50.value[0].field_2;
      DAT_006006ac._4_4_ = local_50.value[0].field_3;
      DAT_006006b4._0_4_ = local_50.value[1].field_0;
      DAT_006006b4._4_4_ = local_50.value[1].field_1;
      DAT_006006bc = local_50.value[1].field_2;
      _DAT_006006c0 = local_50.value[1].field_3;
      DAT_006006c4._0_4_ = local_50.value[2].field_0;
      DAT_006006c4._4_4_ = local_50.value[2].field_1;
      DAT_006006cc._0_4_ = local_50.value[2].field_2;
      DAT_006006cc._4_4_ = local_50.value[2].field_3;
      DAT_006006d4._0_4_ = local_50.value[3].field_0;
      DAT_006006d4._4_4_ = local_50.value[3].field_1;
      DAT_006006dc._0_4_ = local_50.value[3].field_2;
      DAT_006006dc._4_4_ = local_50.value[3].field_3;
      auVar9 = vcvtss2sd_avx512f(in_XMM25,ZEXT416((uint)flightTargetFov));
      fov = auVar9._0_8_;
    }
    requestRedraw();
  }
  return;
}

Assistant:

void updateFlight() {
  if (midflight) {
    if (ImGui::GetTime() > flightEndTime) {
      // Flight is over, ensure we end exactly at target location
      midflight = false;
      viewMat = buildTransform(glm::mat3x4_cast(flightTargetViewR), flightTargetViewT);
      fov = flightTargetFov;
    } else {
      // normalized time for spline on [0,1]
      float t = (ImGui::GetTime() - flightStartTime) / (flightEndTime - flightStartTime);

      float tSmooth = glm::smoothstep(0.f, 1.f, t);

      // linear spline
      glm::dualquat interpR = glm::lerp(flightInitialViewR, flightTargetViewR, tSmooth);

      glm::vec3 interpT = glm::mix(flightInitialViewT, flightTargetViewT, tSmooth);

      viewMat = buildTransform(glm::mat3x4_cast(interpR), interpT);

      // linear spline
      fov = (1.0f - t) * flightInitialFov + t * flightTargetFov;
    }
    requestRedraw(); // flight is still happening, draw again next frame
  }
}